

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O1

void __thiscall
pstd::
vector<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
::clear(vector<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_pstd::pmr::polymorphic_allocator<pstd::optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        *this)

{
  optional<std::pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *poVar1;
  long *plVar2;
  long lVar3;
  ulong uVar4;
  
  if (this->nStored != 0) {
    lVar3 = 0x18;
    uVar4 = 0;
    do {
      poVar1 = this->ptr;
      if ((poVar1->optionalValue).__data[lVar3 + 0x10] == '\x01') {
        plVar2 = *(long **)((long)poVar1 + lVar3 + -0x10);
        if ((long *)((poVar1->optionalValue).__data + lVar3) != plVar2) {
          operator_delete(plVar2,*(long *)((poVar1->optionalValue).__data + lVar3) + 1);
        }
        (poVar1->optionalValue).__data[lVar3 + 0x10] = '\0';
      }
      uVar4 = uVar4 + 1;
      lVar3 = lVar3 + 0x30;
    } while (uVar4 < this->nStored);
  }
  this->nStored = 0;
  return;
}

Assistant:

void clear() {
        for (int i = 0; i < nStored; ++i)
            alloc.destroy(&ptr[i]);
        nStored = 0;
    }